

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

bool __thiscall
wasm::BranchUtils::replacePossibleTarget(BranchUtils *this,Expression *branch,Name from,Name to)

{
  anon_class_24_3_17062666 func;
  Expression *local_50;
  Name from_local;
  Name to_local;
  bool local_11 [8];
  bool worked;
  
  from_local.super_IString.str._M_str = from.super_IString.str._M_str;
  from_local.super_IString.str._M_len = from.super_IString.str._M_len;
  local_11[0] = false;
  func.to = (Name *)&from_local.super_IString.str._M_str;
  func.from = (Name *)&local_50;
  func.worked = local_11;
  local_50 = branch;
  operateOnScopeNameUses<wasm::BranchUtils::replacePossibleTarget(wasm::Expression*,wasm::Name,wasm::Name)::_lambda(wasm::Name&)_1_>
            ((Expression *)this,func);
  return local_11[0];
}

Assistant:

inline bool replacePossibleTarget(Expression* branch, Name from, Name to) {
  bool worked = false;
  operateOnScopeNameUses(branch, [&](Name& name) {
    if (name == from) {
      name = to;
      worked = true;
    }
  });
  return worked;
}